

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O3

void __thiscall
rangeless::fn::impl::
seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
::seq(seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
      *this,seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
            *param_1)

{
  bool bVar1;
  
  (this->m_current).m_empty = true;
  if ((param_1->m_current).m_empty == false) {
    (this->m_current).field_0 = (param_1->m_current).field_0;
    (this->m_current).m_empty = false;
    if ((param_1->m_current).m_empty == false) {
      (param_1->m_current).m_empty = true;
    }
  }
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->m_gen).gen.gen.inps._M_t._M_impl.super__Rb_tree_header,
             &(param_1->m_gen).gen.gen.inps._M_t._M_impl.super__Rb_tree_header);
  (this->m_gen).gen.gen.started = (param_1->m_gen).gen.gen.started;
  (this->m_gen).gen.gen.it._M_node = (param_1->m_gen).gen.gen.it._M_node;
  maybe<std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>::maybe
            (&(this->m_gen).current_group,&(param_1->m_gen).current_group);
  (this->m_gen).it._M_current = (param_1->m_gen).it._M_current;
  bVar1 = param_1->m_ended;
  this->m_started = param_1->m_started;
  this->m_ended = bVar1;
  this->m_resumable = param_1->m_resumable;
  return;
}

Assistant:

seq(seq&&) = default;